

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O1

void __thiscall
cppjieba::MixSegment::Cut
          (MixSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res,bool hmm)

{
  MPSegment *this_00;
  pointer *ppWVar1;
  iterator iVar2;
  Rune *value;
  const_iterator pRVar3;
  bool bVar4;
  size_type __n;
  ulong uVar5;
  undefined7 in_register_00000081;
  ulong uVar6;
  WordRange *pWVar7;
  long lVar8;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> words;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> hmmRes;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> local_78;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> local_58;
  HMMSegment *local_38;
  
  if ((int)CONCAT71(in_register_00000081,hmm) == 0) {
    MPSegment::Cut(&this->mpSeg_,begin,end,res,0x200);
    return;
  }
  local_78.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (end < begin) {
    __assert_fail("end >= begin",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/MixSegment.hpp"
                  ,0x34,
                  "void cppjieba::MixSegment::Cut(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<WordRange> &, bool) const"
                 );
  }
  __n = ((long)end - (long)begin >> 2) * -0x3333333333333333;
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::reserve(&local_78,__n);
  this_00 = &this->mpSeg_;
  MPSegment::Cut(this_00,begin,end,&local_78,0x200);
  local_58.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::reserve(&local_58,__n);
  if (local_78.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      local_78.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl
      .super__Vector_impl_data._M_start) {
    local_38 = &this->hmmSeg_;
    uVar5 = 0;
    do {
      if ((local_78.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar5].left !=
           local_78.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar5].right) ||
         (bVar4 = MPSegment::IsUserDictSingleChineseWord
                            (this_00,&(local_78.
                                       super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar5].left)->rune)
         , bVar4)) {
        pWVar7 = local_78.
                 super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar5;
        iVar2._M_current =
             (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        uVar6 = uVar5;
        if (iVar2._M_current ==
            (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>>::
          _M_realloc_insert<cppjieba::WordRange_const&>
                    ((vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>> *)res,iVar2,
                     pWVar7);
        }
        else {
          pRVar3 = pWVar7->right;
          (iVar2._M_current)->left = pWVar7->left;
          (iVar2._M_current)->right = pRVar3;
          ppWVar1 = &(res->
                     super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppWVar1 = *ppWVar1 + 1;
        }
      }
      else {
        uVar6 = uVar5;
        if (uVar5 < (ulong)((long)local_78.
                                  super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_78.
                                  super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4)) {
          lVar8 = uVar5 * 0x10 + 8;
          do {
            value = *(Rune **)((long)local_78.
                                     super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar8 + -8);
            if ((value != *(Rune **)((long)&(local_78.
                                             super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->left +
                                    lVar8)) ||
               (bVar4 = MPSegment::IsUserDictSingleChineseWord(this_00,value), bVar4)) break;
            uVar6 = uVar6 + 1;
            lVar8 = lVar8 + 0x10;
          } while (uVar6 < (ulong)((long)local_78.
                                         super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_78.
                                         super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
        uVar6 = uVar6 - 1;
        if (uVar6 < uVar5) {
          __assert_fail("j - 1 >= i",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/MixSegment.hpp"
                        ,0x48,
                        "void cppjieba::MixSegment::Cut(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<WordRange> &, bool) const"
                       );
        }
        HMMSegment::Cut(local_38,local_78.
                                 super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar5].left,
                        local_78.
                        super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar6].left + 1,&local_58);
        if (local_58.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_58.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          lVar8 = 0;
          uVar5 = 0;
          do {
            pWVar7 = (WordRange *)
                     ((long)&(local_58.
                              super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                              ._M_impl.super__Vector_impl_data._M_start)->left + lVar8);
            iVar2._M_current =
                 (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>>::
              _M_realloc_insert<cppjieba::WordRange_const&>
                        ((vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>> *)res,
                         iVar2,pWVar7);
            }
            else {
              pRVar3 = pWVar7->right;
              (iVar2._M_current)->left = pWVar7->left;
              (iVar2._M_current)->right = pRVar3;
              ppWVar1 = &(res->
                         super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppWVar1 = *ppWVar1 + 1;
            }
            uVar5 = uVar5 + 1;
            lVar8 = lVar8 + 0x10;
          } while (uVar5 < (ulong)((long)local_58.
                                         super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_58.
                                         super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
        if (local_58.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_58.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          local_58.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_58.
               super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl
               .super__Vector_impl_data._M_start;
        }
      }
      uVar5 = uVar6 + 1;
    } while (uVar5 < (ulong)((long)local_78.
                                   super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_78.
                                   super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  if (local_58.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Cut(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end, vector<WordRange>& res, bool hmm) const {
    if (!hmm) {
      mpSeg_.Cut(begin, end, res);
      return;
    }
    vector<WordRange> words;
    assert(end >= begin);
    words.reserve(end - begin);
    mpSeg_.Cut(begin, end, words);

    vector<WordRange> hmmRes;
    hmmRes.reserve(end - begin);
    for (size_t i = 0; i < words.size(); i++) {
      //if mp Get a word, it's ok, put it into result
      if (words[i].left != words[i].right || (words[i].left == words[i].right && mpSeg_.IsUserDictSingleChineseWord(words[i].left->rune))) {
        res.push_back(words[i]);
        continue;
      }

      // if mp Get a single one and it is not in userdict, collect it in sequence
      size_t j = i;
      while (j < words.size() && words[j].left == words[j].right && !mpSeg_.IsUserDictSingleChineseWord(words[j].left->rune)) {
        j++;
      }

      // Cut the sequence with hmm
      assert(j - 1 >= i);
      // TODO
      hmmSeg_.Cut(words[i].left, words[j - 1].left + 1, hmmRes);
      //put hmm result to result
      for (size_t k = 0; k < hmmRes.size(); k++) {
        res.push_back(hmmRes[k]);
      }

      //clear tmp vars
      hmmRes.clear();

      //let i jump over this piece
      i = j - 1;
    }
  }